

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

void __thiscall r_exec::Group::load_secondary_mdl_controller(Group *this,View *view)

{
  atomic_int_fast64_t *paVar1;
  PrimaryMDLController *this_00;
  View *pVVar2;
  SecondaryMDLController *pSVar3;
  View *this_01;
  mapped_type *pmVar4;
  SecondaryMDLController *this_02;
  __node_gen_type __node_gen;
  atomic_int_fast64_t *local_38;
  View *local_30;
  
  this_00 = (PrimaryMDLController *)(view->controller).object;
  this_01 = (View *)operator_new(0x100);
  r_exec::View::View(this_01,view,true);
  r_code::Atom::Float(0.0);
  r_code::Atom::operator=((Atom *)&(this_01->super_View).field_0x44,(Atom *)&local_38);
  r_code::Atom::~Atom((Atom *)&local_38);
  (this_01->super_View).references[0] = (Code *)this;
  local_38 = (atomic_int_fast64_t *)r_exec::View::get_oid(this_01);
  pmVar4 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->ipgm_views,(key_type *)&local_38);
  pVVar2 = (View *)pmVar4->object;
  if (pVVar2 != this_01) {
    if (pVVar2 != (View *)0x0) {
      LOCK();
      paVar1 = &(pVVar2->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pVVar2->super_View).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
        (*(pVVar2->super_View).super__Object._vptr__Object[1])();
      }
    }
    pmVar4->object = (_Object *)this_01;
    LOCK();
    paVar1 = &(this_01->super_View).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  this_02 = (SecondaryMDLController *)operator_new(0x440);
  SecondaryMDLController::SecondaryMDLController(this_02,(View *)this_01);
  pSVar3 = (SecondaryMDLController *)(this_01->controller).object;
  if (pSVar3 != this_02) {
    if (pSVar3 != (SecondaryMDLController *)0x0) {
      LOCK();
      paVar1 = &(pSVar3->super_MDLController).super_HLPController.super_OController.super_Controller
                .super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pSVar3->super_MDLController).super_HLPController.super_OController.super_Controller.
          super__Object.refCount.super___atomic_base<long>._M_i < 1) {
        (*(pSVar3->super_MDLController).super_HLPController.super_OController.super_Controller.
          super__Object._vptr__Object[1])();
      }
    }
    (this_01->controller).object = (_Object *)this_02;
    LOCK();
    paVar1 = &(this_02->super_MDLController).super_HLPController.super_OController.super_Controller.
              super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_38 = &(view->super_View).object.object[5].refCount;
  local_30 = this_01;
  std::
  _Hashtable<r_code::View*,r_code::View*,std::allocator<r_code::View*>,std::__detail::_Identity,r_code::View::Equal,r_code::View::Hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<r_code::View*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<r_code::View*,true>>>>
            ();
  PrimaryMDLController::set_secondary(this_00,this_02);
  SecondaryMDLController::set_primary(this_02,this_00);
  return;
}

Assistant:

void Group::load_secondary_mdl_controller(View *view)
{
    PrimaryMDLController *p = (PrimaryMDLController *)view->controller;
    View *_view = new View(view, true);
    _view->code(VIEW_ACT) = Atom::Float(0);
    _view->references[0] = this;
    ipgm_views[_view->get_oid()] = _view;
    SecondaryMDLController *s = new SecondaryMDLController(_view);
    _view->controller = s;
    view->object->views.insert(_view);
    p->set_secondary(s);
    s->set_primary(p);
}